

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

void doctest::detail::logAssertThrowsAs
               (bool threw,bool threw_as,char *as,char *expr,Enum assert_type,char *file,int line)

{
  bool bVar1;
  char *pcVar2;
  Code code;
  String local_c78;
  String local_c70;
  String local_c68;
  String local_c60;
  String local_c58;
  Color local_c4e;
  Color local_c4d [7];
  Color col_2;
  Color col_1;
  Color local_c39;
  char local_c38 [7];
  Color col;
  char info1 [1024];
  char msg [1024];
  char loc [1024];
  char *file_local;
  Enum assert_type_local;
  char *expr_local;
  char *as_local;
  bool threw_as_local;
  bool threw_local;
  
  pcVar2 = fileForOutput(file);
  snprintf(msg + 0x3f8,0x400,"%s(%d)",pcVar2,(ulong)(uint)line);
  if (threw_as) {
    snprintf(info1 + 0x3f8,0x400," PASSED!\n");
  }
  else {
    pcVar2 = "(didn\'t throw at all)";
    if (threw) {
      pcVar2 = "(threw something else)";
    }
    snprintf(info1 + 0x3f8,0x400," FAILED! %s\n",pcVar2);
  }
  pcVar2 = getAssertString(assert_type);
  snprintf(local_c38,0x400,"  %s( %s, %s )\n\n",pcVar2,expr,as);
  do {
    if (msg[0x3f8] != '\0') {
      Color::Color(&local_c39,LightGrey);
      printf("%s",msg + 0x3f8);
      Color::~Color(&local_c39);
    }
    bVar1 = always_false();
  } while (bVar1);
  do {
    if (info1[0x3f8] != '\0') {
      code = Red;
      if (threw_as) {
        code = BrightGreen;
      }
      Color::Color(local_c4d,code);
      printf("%s",info1 + 0x3f8);
      Color::~Color(local_c4d);
    }
    bVar1 = always_false();
  } while (bVar1);
  do {
    if (local_c38[0] != '\0') {
      Color::Color(&local_c4e,Cyan);
      printf("%s",local_c38);
      Color::~Color(&local_c4e);
    }
    bVar1 = always_false();
  } while (bVar1);
  String::String(&local_c68,msg + 0x3f8);
  String::String(&local_c70,info1 + 0x3f8);
  String::operator+(&local_c60,&local_c68);
  String::String(&local_c78,local_c38);
  String::operator+(&local_c58,&local_c60);
  printToDebugConsole(&local_c58);
  String::~String(&local_c58);
  String::~String(&local_c78);
  String::~String(&local_c60);
  String::~String(&local_c70);
  String::~String(&local_c68);
  return;
}

Assistant:

void logAssertThrowsAs(bool threw, bool threw_as, const char* as, const char* expr,
                           assertType::Enum assert_type, const char* file, int line) {
        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        if(threw_as)
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " PASSED!\n");
        else
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " FAILED! %s\n",
                             (threw ? "(threw something else)" : "(didn't throw at all)"));

        char info1[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(info1, DOCTEST_COUNTOF(info1), "  %s( %s, %s )\n\n",
                         getAssertString(assert_type), expr, as);

        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, threw_as ? Color::BrightGreen : Color::Red);
        DOCTEST_PRINTF_COLORED(info1, Color::Cyan);

        printToDebugConsole(String(loc) + msg + info1);
    }